

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryPolynomialModel<int,_double>::AddInteraction
          (BinaryPolynomialModel<int,_double> *this,vector<int,_std::allocator<int>_> *key,
          double *value,Vartype vartype)

{
  vector<int,_std::allocator<int>_> copied_key;
  _Vector_base<int,_std::allocator<int>_> _Stack_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&_Stack_38,key);
  AddInteraction(this,(vector<int,_std::allocator<int>_> *)&_Stack_38,value,vartype);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_38);
  return;
}

Assistant:

void AddInteraction( const std::vector<IndexType> &key, const FloatType &value, const Vartype vartype = Vartype::NONE ) {
      std::vector<IndexType> copied_key = key;
      AddInteraction( copied_key, value, vartype );
    }